

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

void __thiscall
LockedPool::LockedPool
          (LockedPool *this,
          unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> *allocator_in,
          LockingFailed_Callback lf_cb_in)

{
  long lVar1;
  __pthread_internal_list *in_RDX;
  mutex *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::unique_ptr
            ((unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> *)in_RDI,
             (unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> *)0x3c51c3)
  ;
  std::__cxx11::list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>::
  list((list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_> *)in_RDI);
  (in_RDI->super___mutex_base)._M_mutex.__data.__list.__next = in_RDX;
  in_RDI[1].super___mutex_base._M_mutex.__align = 0;
  std::mutex::mutex(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

LockedPool::LockedPool(std::unique_ptr<LockedPageAllocator> allocator_in, LockingFailed_Callback lf_cb_in)
    : allocator(std::move(allocator_in)), lf_cb(lf_cb_in)
{
}